

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams_tests.cpp
# Opt level: O3

void __thiscall streams_tests::streams_hashed::test_method(streams_hashed *this)

{
  long lVar1;
  int iVar2;
  iterator in_R8;
  iterator pvVar3;
  iterator in_R9;
  iterator pvVar4;
  long in_FS_OFFSET;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  const_string file;
  const_string file_00;
  const_string msg;
  const_string msg_00;
  undefined1 *local_298;
  undefined1 *local_290;
  char *local_288;
  char *local_280;
  lazy_ostream local_278;
  undefined1 *local_268;
  char *local_260;
  undefined1 *local_258;
  undefined1 *local_250;
  char *local_248;
  char *local_240;
  undefined1 local_238 [40];
  uint256 *local_210;
  undefined **local_208;
  undefined1 local_200;
  undefined1 *local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_1f0;
  uint256 *local_1e8;
  undefined **local_1e0;
  undefined1 local_1d8;
  undefined1 *local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1c0;
  char *local_1b8;
  assertion_result local_1b0;
  undefined1 local_198 [9];
  uchar uStack_18f;
  uchar uStack_18e;
  uchar uStack_18d;
  uchar uStack_18c;
  uchar uStack_18b;
  uchar uStack_18a;
  uchar uStack_189;
  uchar local_188;
  uchar uStack_187;
  uchar uStack_186;
  uchar uStack_185;
  uchar uStack_184;
  uchar uStack_183;
  uchar uStack_182;
  uchar uStack_181;
  uchar uStack_180;
  uchar uStack_17f;
  uchar uStack_17e;
  uchar uStack_17d;
  uchar uStack_17c;
  uchar uStack_17b;
  uchar uStack_17a;
  uchar uStack_179;
  undefined1 local_178 [16];
  shared_count asStack_168 [2];
  string result;
  HashVerifier<DataStream> hash_verifier;
  string data;
  HashedSourceWriter<DataStream> hash_writer;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_238._16_16_ = (undefined1  [16])0x0;
  local_238._0_16_ = (undefined1  [16])0x0;
  hash_writer.super_HashWriter.ctx.buf[0x30] = '\0';
  hash_writer.super_HashWriter.ctx.buf[0x31] = '\0';
  hash_writer.super_HashWriter.ctx.buf[0x32] = '\0';
  hash_writer.super_HashWriter.ctx.buf[0x33] = '\0';
  hash_writer.super_HashWriter.ctx.buf[0x34] = '\0';
  hash_writer.super_HashWriter.ctx.buf[0x35] = '\0';
  hash_writer.super_HashWriter.ctx.buf[0x36] = '\0';
  hash_writer.super_HashWriter.ctx.buf[0x37] = '\0';
  hash_writer.super_HashWriter.ctx.buf[0x38] = '\0';
  hash_writer.super_HashWriter.ctx.buf[0x39] = '\0';
  hash_writer.super_HashWriter.ctx.buf[0x3a] = '\0';
  hash_writer.super_HashWriter.ctx.buf[0x3b] = '\0';
  hash_writer.super_HashWriter.ctx.buf[0x3c] = '\0';
  hash_writer.super_HashWriter.ctx.buf[0x3d] = '\0';
  hash_writer.super_HashWriter.ctx.buf[0x3e] = '\0';
  hash_writer.super_HashWriter.ctx.buf[0x3f] = '\0';
  hash_writer.super_HashWriter.ctx.buf[0x20] = '\0';
  hash_writer.super_HashWriter.ctx.buf[0x21] = '\0';
  hash_writer.super_HashWriter.ctx.buf[0x22] = '\0';
  hash_writer.super_HashWriter.ctx.buf[0x23] = '\0';
  hash_writer.super_HashWriter.ctx.buf[0x24] = '\0';
  hash_writer.super_HashWriter.ctx.buf[0x25] = '\0';
  hash_writer.super_HashWriter.ctx.buf[0x26] = '\0';
  hash_writer.super_HashWriter.ctx.buf[0x27] = '\0';
  hash_writer.super_HashWriter.ctx.buf[0x28] = '\0';
  hash_writer.super_HashWriter.ctx.buf[0x29] = '\0';
  hash_writer.super_HashWriter.ctx.buf[0x2a] = '\0';
  hash_writer.super_HashWriter.ctx.buf[0x2b] = '\0';
  hash_writer.super_HashWriter.ctx.buf[0x2c] = '\0';
  hash_writer.super_HashWriter.ctx.buf[0x2d] = '\0';
  hash_writer.super_HashWriter.ctx.buf[0x2e] = '\0';
  hash_writer.super_HashWriter.ctx.buf[0x2f] = '\0';
  hash_writer.super_HashWriter.ctx.buf[0x10] = '\0';
  hash_writer.super_HashWriter.ctx.buf[0x11] = '\0';
  hash_writer.super_HashWriter.ctx.buf[0x12] = '\0';
  hash_writer.super_HashWriter.ctx.buf[0x13] = '\0';
  hash_writer.super_HashWriter.ctx.buf[0x14] = '\0';
  hash_writer.super_HashWriter.ctx.buf[0x15] = '\0';
  hash_writer.super_HashWriter.ctx.buf[0x16] = '\0';
  hash_writer.super_HashWriter.ctx.buf[0x17] = '\0';
  hash_writer.super_HashWriter.ctx.buf[0x18] = '\0';
  hash_writer.super_HashWriter.ctx.buf[0x19] = '\0';
  hash_writer.super_HashWriter.ctx.buf[0x1a] = '\0';
  hash_writer.super_HashWriter.ctx.buf[0x1b] = '\0';
  hash_writer.super_HashWriter.ctx.buf[0x1c] = '\0';
  hash_writer.super_HashWriter.ctx.buf[0x1d] = '\0';
  hash_writer.super_HashWriter.ctx.buf[0x1e] = '\0';
  hash_writer.super_HashWriter.ctx.buf[0x1f] = '\0';
  hash_writer.super_HashWriter.ctx.buf[0] = '\0';
  hash_writer.super_HashWriter.ctx.buf[1] = '\0';
  hash_writer.super_HashWriter.ctx.buf[2] = '\0';
  hash_writer.super_HashWriter.ctx.buf[3] = '\0';
  hash_writer.super_HashWriter.ctx.buf[4] = '\0';
  hash_writer.super_HashWriter.ctx.buf[5] = '\0';
  hash_writer.super_HashWriter.ctx.buf[6] = '\0';
  hash_writer.super_HashWriter.ctx.buf[7] = '\0';
  hash_writer.super_HashWriter.ctx.buf[8] = '\0';
  hash_writer.super_HashWriter.ctx.buf[9] = '\0';
  hash_writer.super_HashWriter.ctx.buf[10] = '\0';
  hash_writer.super_HashWriter.ctx.buf[0xb] = '\0';
  hash_writer.super_HashWriter.ctx.buf[0xc] = '\0';
  hash_writer.super_HashWriter.ctx.buf[0xd] = '\0';
  hash_writer.super_HashWriter.ctx.buf[0xe] = '\0';
  hash_writer.super_HashWriter.ctx.buf[0xf] = '\0';
  hash_writer.super_HashWriter.ctx.s[4] = 0;
  hash_writer.super_HashWriter.ctx.s[5] = 0;
  hash_writer.super_HashWriter.ctx.s[6] = 0;
  hash_writer.super_HashWriter.ctx.s[7] = 0;
  hash_writer.super_HashWriter.ctx.s[0] = 0;
  hash_writer.super_HashWriter.ctx.s[1] = 0;
  hash_writer.super_HashWriter.ctx.s[2] = 0;
  hash_writer.super_HashWriter.ctx.s[3] = 0;
  hash_writer.super_HashWriter.ctx.bytes = 0;
  CSHA256::CSHA256((CSHA256 *)&hash_writer);
  data._M_dataplus._M_p = (pointer)&data.field_2;
  hash_writer.m_source = (DataStream *)local_238;
  std::__cxx11::string::_M_construct<char_const*>((string *)&data,"bitcoin","");
  Serialize<HashedSourceWriter<DataStream>,char>(&hash_writer,&data);
  CSHA256::CSHA256((CSHA256 *)&hash_verifier);
  result._M_dataplus._M_p = (pointer)&result.field_2;
  result._M_string_length = 0;
  result.field_2._M_local_buf[0] = '\0';
  hash_verifier.m_source = (DataStream *)local_238;
  Unserialize<HashVerifier<DataStream>,char>(&hash_verifier,&result);
  local_248 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_240 = "";
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  local_250 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x236;
  file.m_begin = (iterator)&local_248;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_258,msg);
  local_278.m_empty = false;
  local_278._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_268 = boost::unit_test::lazy_ostream::inst;
  local_260 = "";
  if (data._M_string_length == result._M_string_length) {
    if (data._M_string_length == 0) {
      local_178[0] = (class_property<bool>)true;
    }
    else {
      iVar2 = bcmp(data._M_dataplus._M_p,result._M_dataplus._M_p,data._M_string_length);
      local_178[0] = (class_property<bool>)(iVar2 == 0);
    }
  }
  else {
    local_178[0] = (class_property<bool>)false;
  }
  local_178[8] = '\0';
  local_178[9] = '\0';
  local_178[10] = '\0';
  local_178[0xb] = '\0';
  local_178[0xc] = '\0';
  local_178[0xd] = '\0';
  local_178[0xe] = '\0';
  local_178[0xf] = '\0';
  asStack_168[0].pi_ = (sp_counted_base *)0x0;
  local_198._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp"
  ;
  stack0xfffffffffffffe70 = "";
  local_1c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&local_1b0;
  local_1d8 = 0;
  local_1e0 = &PTR__lazy_ostream_013ae148;
  local_1d0 = boost::unit_test::lazy_ostream::inst;
  local_1f0 = &local_1c0;
  local_200 = 0;
  local_208 = &PTR__lazy_ostream_013ae148;
  local_1f8 = boost::unit_test::lazy_ostream::inst;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  local_1c0 = &result;
  local_1b0._0_8_ = &data;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_178,&local_278,1,2,REQUIRE,0x113f056,(size_t)local_198,0x236,
             &local_1e0,"result",&local_208);
  boost::detail::shared_count::~shared_count(asStack_168);
  local_288 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_280 = "";
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x237;
  file_00.m_begin = (iterator)&local_288;
  msg_00.m_end = pvVar4;
  msg_00.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_298,
             msg_00);
  local_278.m_empty = false;
  local_278._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_268 = boost::unit_test::lazy_ostream::inst;
  local_260 = "";
  HashWriter::GetHash((uint256 *)local_178,&hash_writer.super_HashWriter);
  HashWriter::GetHash((uint256 *)local_198,&hash_verifier.super_HashWriter);
  auVar6[0] = -(local_198[0] == local_178[0]);
  auVar6[1] = -(local_198[1] == local_178[1]);
  auVar6[2] = -(local_198[2] == local_178[2]);
  auVar6[3] = -(local_198[3] == local_178[3]);
  auVar6[4] = -(local_198[4] == local_178[4]);
  auVar6[5] = -(local_198[5] == local_178[5]);
  auVar6[6] = -(local_198[6] == local_178[6]);
  auVar6[7] = -(local_198[7] == local_178[7]);
  auVar6[8] = -(local_198[8] == local_178[8]);
  auVar6[9] = -(uStack_18f == local_178[9]);
  auVar6[10] = -(uStack_18e == local_178[10]);
  auVar6[0xb] = -(uStack_18d == local_178[0xb]);
  auVar6[0xc] = -(uStack_18c == local_178[0xc]);
  auVar6[0xd] = -(uStack_18b == local_178[0xd]);
  auVar6[0xe] = -(uStack_18a == local_178[0xe]);
  auVar6[0xf] = -(uStack_189 == local_178[0xf]);
  auVar5[0] = -(local_188 == (uchar)asStack_168[0].pi_);
  auVar5[1] = -(uStack_187 == (uchar)((ulong)asStack_168[0].pi_ >> 8));
  auVar5[2] = -(uStack_186 == (uchar)((ulong)asStack_168[0].pi_ >> 0x10));
  auVar5[3] = -(uStack_185 == (uchar)((ulong)asStack_168[0].pi_ >> 0x18));
  auVar5[4] = -(uStack_184 == (uchar)((ulong)asStack_168[0].pi_ >> 0x20));
  auVar5[5] = -(uStack_183 == (uchar)((ulong)asStack_168[0].pi_ >> 0x28));
  auVar5[6] = -(uStack_182 == (uchar)((ulong)asStack_168[0].pi_ >> 0x30));
  auVar5[7] = -(uStack_181 == (uchar)((ulong)asStack_168[0].pi_ >> 0x38));
  auVar5[8] = -(uStack_180 == (uchar)asStack_168[1].pi_);
  auVar5[9] = -(uStack_17f == (uchar)((ulong)asStack_168[1].pi_ >> 8));
  auVar5[10] = -(uStack_17e == (uchar)((ulong)asStack_168[1].pi_ >> 0x10));
  auVar5[0xb] = -(uStack_17d == (uchar)((ulong)asStack_168[1].pi_ >> 0x18));
  auVar5[0xc] = -(uStack_17c == (uchar)((ulong)asStack_168[1].pi_ >> 0x20));
  auVar5[0xd] = -(uStack_17b == (uchar)((ulong)asStack_168[1].pi_ >> 0x28));
  auVar5[0xe] = -(uStack_17a == (uchar)((ulong)asStack_168[1].pi_ >> 0x30));
  auVar5[0xf] = -(uStack_179 == (uchar)((ulong)asStack_168[1].pi_ >> 0x38));
  auVar5 = auVar5 & auVar6;
  local_1b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)
       ((ushort)((ushort)(SUB161(auVar5 >> 7,0) & 1) | (ushort)(SUB161(auVar5 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar5 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar5 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar5 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar5 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar5 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar5 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar5 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar5 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar5 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar5 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar5 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar5 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar5 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar5[0xf] >> 7) << 0xf) == 0xffff);
  local_1b0.m_message.px = (element_type *)0x0;
  local_1b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xf45e1a;
  local_1b8 = "";
  local_1c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&local_1e8;
  local_1d8 = 0;
  local_1e0 = &PTR__lazy_ostream_013aed38;
  local_1d0 = boost::unit_test::lazy_ostream::inst;
  local_1f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&local_210;
  local_200 = 0;
  local_208 = &PTR__lazy_ostream_013aed38;
  local_1f8 = boost::unit_test::lazy_ostream::inst;
  local_210 = (uint256 *)local_198;
  local_1e8 = (uint256 *)local_178;
  boost::test_tools::tt_detail::report_assertion
            (&local_1b0,&local_278,1,2,REQUIRE,0xf468a4,(size_t)&local_1c0,0x237,&local_1e0,
             "hash_verifier.GetHash()",&local_208);
  boost::detail::shared_count::~shared_count(&local_1b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)result._M_dataplus._M_p != &result.field_2) {
    operator_delete(result._M_dataplus._M_p,
                    CONCAT71(result.field_2._M_allocated_capacity._1_7_,
                             result.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)data._M_dataplus._M_p != &data.field_2) {
    operator_delete(data._M_dataplus._M_p,data.field_2._M_allocated_capacity + 1);
  }
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)local_238);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(streams_hashed)
{
    DataStream stream{};
    HashedSourceWriter hash_writer{stream};
    const std::string data{"bitcoin"};
    hash_writer << data;

    HashVerifier hash_verifier{stream};
    std::string result;
    hash_verifier >> result;
    BOOST_CHECK_EQUAL(data, result);
    BOOST_CHECK_EQUAL(hash_writer.GetHash(), hash_verifier.GetHash());
}